

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-interp.cc
# Opt level: O1

void __thiscall InterpTest::~InterpTest(InterpTest *this)

{
  pointer puVar1;
  pointer pRVar2;
  
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__InterpTest_002ce910;
  if ((this->inst_).obj_ != (Instance *)0x0) {
    wabt::interp::Store::DeleteRoot((this->inst_).store_,(this->inst_).root_index_);
    (this->inst_).obj_ = (Instance *)0x0;
    (this->inst_).store_ = (Store *)0x0;
    (this->inst_).root_index_ = 0;
  }
  if ((this->mod_).obj_ != (Module *)0x0) {
    wabt::interp::Store::DeleteRoot((this->mod_).store_,(this->mod_).root_index_);
    (this->mod_).obj_ = (Module *)0x0;
    (this->mod_).store_ = (Store *)0x0;
    (this->mod_).root_index_ = 0;
  }
  wabt::interp::ModuleDesc::~ModuleDesc(&this->module_desc_);
  std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
            (&(this->store_).marks_.super__Bvector_base<std::allocator<bool>_>);
  std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
            (&(this->store_).roots_.is_free_.super__Bvector_base<std::allocator<bool>_>);
  puVar1 = (this->store_).roots_.free_.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  pRVar2 = (this->store_).roots_.list_.
           super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pRVar2 != (pointer)0x0) {
    operator_delete(pRVar2);
  }
  std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
            (&(this->store_).objects_.is_free_.super__Bvector_base<std::allocator<bool>_>);
  puVar1 = (this->store_).objects_.free_.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  std::
  vector<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>,_std::allocator<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>_>
  ::~vector(&(this->store_).objects_.list_);
  testing::Test::~Test(&this->super_Test);
  return;
}

Assistant:

void ReadModule(const std::vector<u8>& data) {
    Errors errors;
    ReadBinaryOptions options;
    Result result = ReadBinaryInterp(data.data(), data.size(), options, &errors,
                                     &module_desc_);
    ASSERT_EQ(Result::Ok, result)
        << FormatErrorsToString(errors, Location::Type::Binary);
  }